

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TSymbolValidater::operator()
          (TSymbolValidater *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  EShLanguage language;
  TIntermSymbol *pTVar1;
  undefined8 uVar2;
  TInfoSink *pTVar3;
  TType *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer ppVar10;
  TType *pTVar11;
  undefined4 extraout_var_07;
  TQualifier *pTVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar13;
  pointer pTVar14;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ulong uVar15;
  char *pcVar16;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  size_type sVar17;
  const_reference pvVar18;
  undefined4 extraout_var_36;
  uint uVar19;
  bool local_5b1;
  bool local_591;
  bool local_52a;
  bool local_529;
  undefined1 local_520 [8];
  TString err_5;
  _Self local_4f0;
  undefined1 local_4e8 [8];
  TString memberName;
  size_t memberIdx;
  TTypeList *blockType1;
  string local_4a8;
  byte local_483;
  byte local_482;
  allocator<char> local_481;
  string local_480;
  TType *local_460;
  TType *type2_1;
  TType *type1_1;
  TString err_4;
  TString err_3;
  _Self local_3f8;
  iterator ent2_2;
  undefined1 local_3e8 [4];
  int i_2;
  TString err_2;
  TType subType_2;
  _Self local_320;
  iterator ent2_1;
  TString errorStr;
  TString err_1;
  undefined1 local_2c0 [8];
  TString name_2;
  undefined1 local_290 [8];
  TString name_1;
  TString err;
  TType subType_1;
  string local_1a0;
  TType *local_180;
  TType *type2;
  TType *type1;
  _Base_ptr local_168;
  _Self local_160;
  iterator var;
  iterator iStack_148;
  uint32_t location;
  iterator ent2;
  undefined1 local_138 [8];
  TType subType;
  int i_1;
  int i;
  EShLanguage nextStage;
  EShLanguage currentStage;
  EShLanguage preStage;
  EShLanguage stage;
  TString mangleName2;
  TString mangleName1;
  TString *name;
  TType *type;
  TIntermSymbol *base;
  TVarEntryInfo *ent1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *entKey_local;
  TSymbolValidater *this_local;
  TType *pTVar8;
  undefined4 extraout_var_06;
  
  pTVar1 = (entKey->second).symbol;
  iVar7 = (*(((entKey->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
            [0x1e])();
  pTVar8 = (TType *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               ((long)&mangleName2.field_2 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &preStage);
  language = (entKey->second).stage;
  nextStage = EShLangCount;
  subType.spirvType._4_4_ = language;
  do {
    subType.spirvType._4_4_ = subType.spirvType._4_4_ - EShLangTessControl;
    if ((int)subType.spirvType._4_4_ < 0) goto LAB_0064306a;
  } while (this->inVarMaps[(int)subType.spirvType._4_4_] == (TVarLiveMap *)0x0);
  nextStage = subType.spirvType._4_4_;
LAB_0064306a:
  i_1 = 0xe;
  subType.spirvType._0_4_ = language;
  do {
    subType.spirvType._0_4_ = (EShLanguage)subType.spirvType + EShLangTessControl;
    if (0xd < (int)(EShLanguage)subType.spirvType) goto LAB_006430ce;
  } while (this->inVarMaps[(int)(EShLanguage)subType.spirvType] == (TVarLiveMap *)0x0);
  i_1 = (EShLanguage)subType.spirvType;
LAB_006430ce:
  iVar7 = (*pTVar8->_vptr_TType[0xb])();
  bVar5 = TQualifier::isArrayedIo((TQualifier *)CONCAT44(extraout_var_00,iVar7),language);
  if (bVar5) {
    TType::TType((TType *)local_138,pTVar8,0,false);
    TType::appendMangledName((TType *)local_138,(TString *)((long)&mangleName2.field_2 + 8));
    TType::~TType((TType *)local_138);
  }
  else {
    TType::appendMangledName(pTVar8,(TString *)((long)&mangleName2.field_2 + 8));
  }
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if (((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 8) & 0x7f) != 3) {
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_19,iVar7) + 8) & 0x7f) == 4) {
      if (i_1 == 0xe) {
        ent2._M_node._4_4_ = 1;
        goto LAB_0064432f;
      }
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
      bVar5 = TSymbolTable::isBuiltInSymbol(CONCAT44(extraout_var_20,iVar7));
      if (bVar5) {
        ent2._M_node._4_4_ = 1;
        goto LAB_0064432f;
      }
      if (this->inVarMaps[(uint)i_1] != (TVarLiveMap *)0x0) {
        local_320._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
             ::find(this->inVarMaps[(uint)i_1],&entKey->first);
        subType_2.spirvType =
             (TSpirvType *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
             ::end(this->inVarMaps[(uint)i_1]);
        bVar5 = std::operator!=(&local_320,(_Self *)&subType_2.spirvType);
        if (bVar5) {
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                    ::operator->(&local_320);
          iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                    _vptr_TIntermNode[0x1e])();
          pTVar12 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar7) + 0x58))();
          bVar5 = TQualifier::isArrayedIo(pTVar12,i_1);
          if (bVar5) {
            ppVar10 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator->(&local_320);
            iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            TType::TType((TType *)((long)&err_2.field_2 + 8),
                         (TType *)CONCAT44(extraout_var_22,iVar7),0,false);
            TType::appendMangledName((TType *)((long)&err_2.field_2 + 8),(TString *)&preStage);
            TType::~TType((TType *)((long)&err_2.field_2 + 8));
          }
          else {
            ppVar10 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator->(&local_320);
            iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                      _vptr_TIntermNode[0x1e])();
            TType::appendMangledName((TType *)CONCAT44(extraout_var_23,iVar7),(TString *)&preStage);
          }
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)((long)&mangleName2.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)&preStage);
          if (bVar5) {
            ent2._M_node._4_4_ = 1;
            goto LAB_0064432f;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_3e8,"Invalid In/Out variable type : ",&entKey->first);
          pTVar3 = this->infoSink;
          pcVar16 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)local_3e8);
          TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
          *this->hadError = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_3e8);
        }
        ent2._M_node._4_4_ = 1;
        goto LAB_0064432f;
      }
    }
    else {
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      bVar5 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_24,iVar7));
      if (bVar5) {
        iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        bVar5 = TQualifier::isPushConstant((TQualifier *)CONCAT44(extraout_var_25,iVar7));
        if (!bVar5) {
          for (ent2_2._M_node._4_4_ = EShLangVertex; (int)ent2_2._M_node._4_4_ < 0xe;
              ent2_2._M_node._4_4_ = ent2_2._M_node._4_4_ + EShLangTessControl) {
            if ((ent2_2._M_node._4_4_ != language) &&
               (this->outVarMaps[(int)ent2_2._M_node._4_4_] != (TVarLiveMap *)0x0)) {
              local_3f8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(this->uniformVarMap[(int)ent2_2._M_node._4_4_],&entKey->first);
              err_3.field_2._8_8_ =
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::end(this->uniformVarMap[(int)ent2_2._M_node._4_4_]);
              bVar5 = std::operator!=(&local_3f8,(_Self *)((long)&err_3.field_2 + 8));
              if (bVar5) {
                ppVar10 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                          ::operator->(&local_3f8);
                iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                TType::appendMangledName
                          ((TType *)CONCAT44(extraout_var_26,iVar7),(TString *)&preStage);
                bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         *)((long)&mangleName2.field_2 + 8),
                                        (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         *)&preStage);
                if (bVar5) {
                  ppVar10 = std::
                            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                            ::operator->(&local_3f8);
                  iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                            _vptr_TIntermNode[0x1e])();
                  TType::sameElementType
                            ((TType *)CONCAT44(extraout_var_27,iVar7),pTVar8,(int *)0x0,(int *)0x0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)((long)&err_4.field_2 + 8),"Invalid Uniform variable type : ",
                                 &entKey->first);
                  pTVar3 = this->infoSink;
                  pcVar16 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)((long)&err_4.field_2 + 8));
                  TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
                  *this->hadError = true;
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)((long)&err_4.field_2 + 8));
                }
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::clear
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&preStage);
                if ((*this->hadError & 1U) == 0) {
                  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    ();
                  iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar7) + 0x38))();
                  if (iVar7 == 0x10) {
                    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32]
                            )();
                    bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_29,iVar7));
                    ppVar10 = std::
                              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                              ::operator->(&local_3f8);
                    iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                              _vptr_TIntermNode[0x32])();
                    bVar6 = IsAnonymous((TString *)CONCAT44(extraout_var_30,iVar7));
                    if (bVar5 != bVar6) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)&type1_1,
                                     "Matched uniform block names must also either all be lacking an instance name or all having an instance name: "
                                     ,&entKey->first);
                      pTVar3 = this->infoSink;
                      pcVar16 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                         *)&type1_1);
                      TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
                      *this->hadError = true;
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)&type1_1);
                    }
                  }
                }
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
                type2_1 = (TType *)CONCAT44(extraout_var_31,iVar7);
                ppVar10 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                          ::operator->(&local_3f8);
                iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                local_460 = (TType *)CONCAT44(extraout_var_32,iVar7);
                if ((*this->hadError & 1U) == 0) {
                  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                    ();
                  iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_33,iVar7) + 0x38))();
                  pTVar4 = type2_1;
                  pTVar11 = local_460;
                  if (iVar7 == 0x10) {
                    local_482 = 0;
                    local_483 = 0;
                    local_591 = true;
                    if ((*this->hadError & 1U) == 0) {
                      pcVar16 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::c_str(&entKey->first);
                      std::allocator<char>::allocator();
                      local_482 = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_480,pcVar16,&local_481);
                      local_483 = 1;
                      local_591 = typeCheck(this,pTVar4,pTVar11,&local_480,true);
                    }
                    *this->hadError = local_591;
                    if ((local_483 & 1) != 0) {
                      std::__cxx11::string::~string((string *)&local_480);
                    }
                    if ((local_482 & 1) != 0) {
                      std::allocator<char>::~allocator(&local_481);
                    }
                    goto LAB_00644309;
                  }
                }
                pTVar4 = type2_1;
                pTVar11 = local_460;
                blockType1._6_1_ = 0;
                blockType1._5_1_ = 0;
                local_5b1 = true;
                if ((*this->hadError & 1U) == 0) {
                  pcVar16 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str(&entKey->first);
                  std::allocator<char>::allocator();
                  blockType1._6_1_ = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_4a8,pcVar16,(allocator<char> *)((long)&blockType1 + 7)
                            );
                  blockType1._5_1_ = 1;
                  local_5b1 = typeCheck(this,pTVar4,pTVar11,&local_4a8,false);
                }
                *this->hadError = local_5b1;
                if ((blockType1._5_1_ & 1) != 0) {
                  std::__cxx11::string::~string((string *)&local_4a8);
                }
                if ((blockType1._6_1_ & 1) != 0) {
                  std::allocator<char>::~allocator((allocator<char> *)((long)&blockType1 + 7));
                }
              }
              else {
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
                if (iVar7 == 0x10) {
                  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                    ();
                  bVar5 = IsAnonymous((TString *)CONCAT44(extraout_var_34,iVar7));
                  if (bVar5) {
                    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                            )();
                    pvVar13 = &TType::getStruct((TType *)CONCAT44(extraout_var_35,iVar7))->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ;
                    for (memberName.field_2._8_8_ = 0; uVar2 = memberName.field_2._8_8_,
                        sVar17 = std::
                                 vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                 ::size(pvVar13), (ulong)uVar2 < sVar17;
                        memberName.field_2._8_8_ = memberName.field_2._8_8_ + 1) {
                      pvVar18 = std::
                                vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ::operator[](pvVar13,memberName.field_2._8_8_);
                      iVar7 = (*pvVar18->type->_vptr_TType[6])();
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)local_4e8,
                                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    *)CONCAT44(extraout_var_36,iVar7));
                      local_4f0._M_node =
                           (_Base_ptr)
                           std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                           ::find(this->uniformVarMap[(int)ent2_2._M_node._4_4_],
                                  (key_type *)local_4e8);
                      err_5.field_2._8_8_ =
                           std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                           ::end(this->uniformVarMap[(int)ent2_2._M_node._4_4_]);
                      bVar5 = std::operator!=(&local_4f0,(_Self *)((long)&err_5.field_2 + 8));
                      if (bVar5) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)local_520,"Invalid Uniform variable name : ",
                                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        *)local_4e8);
                        pTVar3 = this->infoSink;
                        pcVar16 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           *)local_520);
                        TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
                        *this->hadError = true;
                        ent2._M_node._4_4_ = 0xe;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)local_520);
                      }
                      else {
                        ent2._M_node._4_4_ = 0;
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)local_4e8);
                      if (ent2._M_node._4_4_ != 0) break;
                    }
                  }
                }
              }
            }
LAB_00644309:
          }
        }
      }
    }
LAB_00644325:
    ent2._M_node._4_4_ = 0;
    goto LAB_0064432f;
  }
  if (nextStage == EShLangCount) {
    ent2._M_node._4_4_ = 1;
    goto LAB_0064432f;
  }
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  bVar5 = TSymbolTable::isBuiltInSymbol(CONCAT44(extraout_var_02,iVar7));
  if (bVar5) {
    ent2._M_node._4_4_ = 1;
    goto LAB_0064432f;
  }
  if (this->outVarMaps[nextStage] == (TVarLiveMap *)0x0) goto LAB_00644325;
  iStack_148 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               ::find(this->outVarMaps[nextStage],&entKey->first);
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x58))();
  uVar19 = (uint)*(undefined8 *)(lVar9 + 0x1c) & 0xfff;
  var = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::end(this->outVarMaps[nextStage]);
  local_529 = std::operator==(&stack0xfffffffffffffeb8,&var);
  local_529 = local_529 && uVar19 != 0xfff;
  if (local_529) {
    local_160._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         ::begin(this->outVarMaps[nextStage]);
    while (bVar5 = std::operator!=(&local_160,&stack0xfffffffffffffeb8), bVar5) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                ::operator->(&local_160);
      iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x58))();
      if (((uint)*(undefined8 *)(lVar9 + 0x1c) & 0xfff) == uVar19) {
        iStack_148._M_node = local_160._M_node;
        break;
      }
      local_168 = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                  ::operator++(&local_160,0);
    }
  }
  type1 = (TType *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::end(this->outVarMaps[nextStage]);
  bVar5 = std::operator!=(&stack0xfffffffffffffeb8,(_Self *)&type1);
  if (bVar5) {
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    type2 = (TType *)CONCAT44(extraout_var_05,iVar7);
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
              ::operator->(&stack0xfffffffffffffeb8);
    iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x1e])();
    pTVar8 = type2;
    pTVar11 = (TType *)CONCAT44(extraout_var_06,iVar7);
    subType_1.spirvType._6_1_ = 0;
    subType_1.spirvType._5_1_ = 0;
    local_52a = true;
    local_180 = pTVar11;
    if ((*this->hadError & 1U) == 0) {
      pcVar16 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (&entKey->first);
      std::allocator<char>::allocator();
      subType_1.spirvType._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,pcVar16,(allocator<char> *)((long)&subType_1.spirvType + 7));
      subType_1.spirvType._5_1_ = 1;
      local_52a = typeCheck(this,pTVar8,pTVar11,&local_1a0,false);
    }
    *this->hadError = local_52a;
    if ((subType_1.spirvType._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    if ((subType_1.spirvType._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&subType_1.spirvType + 7));
    }
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
              ::operator->(&stack0xfffffffffffffeb8);
    iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
              [0x1e])();
    pTVar12 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x58))();
    bVar5 = TQualifier::isArrayedIo(pTVar12,nextStage);
    if (bVar5) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                ::operator->(&stack0xfffffffffffffeb8);
      iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      TType::TType((TType *)((long)&err.field_2 + 8),(TType *)CONCAT44(extraout_var_08,iVar7),0,
                   false);
      TType::appendMangledName((TType *)((long)&err.field_2 + 8),(TString *)&preStage);
      TType::~TType((TType *)((long)&err.field_2 + 8));
    }
    else {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                ::operator->(&stack0xfffffffffffffeb8);
      iVar7 = (*(((ppVar10->second).symbol)->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      TType::appendMangledName((TType *)CONCAT44(extraout_var_09,iVar7),(TString *)&preStage);
    }
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)((long)&mangleName2.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&preStage);
    if (bVar5) {
      if ((((this->profile == EEsProfile) && (this->version == 300)) &&
          ((entKey->second).stage == EShLangFragment)) &&
         (uVar19 = (*type2->_vptr_TType[0x29])(), (uVar19 & 1) == 0)) {
        iVar7 = (*type2->_vptr_TType[0xb])();
        uVar15 = *(ulong *)(CONCAT44(extraout_var_10,iVar7) + 8);
        iVar7 = (*local_180->_vptr_TType[0xb])();
        if (((byte)(uVar15 >> 0x1f) & 1) ==
            ((byte)(*(ulong *)(CONCAT44(extraout_var_11,iVar7) + 8) >> 0x1f) & 1)) {
          iVar7 = (*type2->_vptr_TType[0xb])();
          uVar15 = *(ulong *)(CONCAT44(extraout_var_12,iVar7) + 8);
          iVar7 = (*local_180->_vptr_TType[0xb])();
          if (((byte)(uVar15 >> 0x25) & 1) ==
              ((byte)(*(ulong *)(CONCAT44(extraout_var_13,iVar7) + 8) >> 0x25) & 1))
          goto LAB_0064367a;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )((long)&name_1.field_2 + 8),"Interpolation qualifier mismatch : ",
                       &entKey->first);
        pTVar3 = this->infoSink;
        pcVar16 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)((long)&name_1.field_2 + 8));
        TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
        *this->hadError = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      ((long)&name_1.field_2 + 8));
      }
LAB_0064367a:
      ent2._M_node._4_4_ = 1;
      goto LAB_0064432f;
    }
    iVar7 = (*type2->_vptr_TType[7])();
    if (((iVar7 == 0x10) && (uVar19 = (*type2->_vptr_TType[0x25])(), (uVar19 & 1) != 0)) &&
       (uVar19 = (*local_180->_vptr_TType[0x25])(), (uVar19 & 1) == 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_290);
      pvVar13 = &TType::getStruct(type2)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      name_2.field_2._8_8_ =
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                     (pvVar13);
      pTVar14 = __gnu_cxx::
                __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)((long)&name_2.field_2 + 8));
      TType::appendMangledName(pTVar14->type,(TString *)local_290);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_290,
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&preStage);
      if (bVar5) {
        iVar7 = (*type2->_vptr_TType[0xb])();
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_14,iVar7) + 0x1c);
        iVar7 = (*local_180->_vptr_TType[0xb])();
        if (((uint)uVar2 & 0xfff) !=
            ((uint)*(undefined8 *)(CONCAT44(extraout_var_15,iVar7) + 0x1c) & 0xfff))
        goto LAB_00643776;
        ent2._M_node._4_4_ = 1;
      }
      else {
LAB_00643776:
        ent2._M_node._4_4_ = 0;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_290);
      if (ent2._M_node._4_4_ != 0) goto LAB_0064432f;
    }
    iVar7 = (*local_180->_vptr_TType[7])();
    if (((iVar7 == 0x10) && (uVar19 = (*local_180->_vptr_TType[0x25])(), (uVar19 & 1) != 0)) &&
       (uVar19 = (*type2->_vptr_TType[0x25])(), (uVar19 & 1) == 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_2c0);
      pvVar13 = &TType::getStruct(local_180)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      err_1.field_2._8_8_ =
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                     (pvVar13);
      pTVar14 = __gnu_cxx::
                __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                ::operator->((__normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                              *)((long)&err_1.field_2 + 8));
      TType::appendMangledName(pTVar14->type,(TString *)local_2c0);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_2c0,
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)((long)&mangleName2.field_2 + 8));
      if (bVar5) {
        iVar7 = (*type2->_vptr_TType[0xb])();
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_16,iVar7) + 0x1c);
        iVar7 = (*local_180->_vptr_TType[0xb])();
        if (((uint)uVar2 & 0xfff) !=
            ((uint)*(undefined8 *)(CONCAT44(extraout_var_17,iVar7) + 0x1c) & 0xfff))
        goto LAB_0064388b;
        ent2._M_node._4_4_ = 1;
      }
      else {
LAB_0064388b:
        ent2._M_node._4_4_ = 0;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_2c0);
      if (ent2._M_node._4_4_ != 0) goto LAB_0064432f;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   ((long)&errorStr.field_2 + 8),"Invalid In/Out variable type : ",&entKey->first);
    pTVar3 = this->infoSink;
    pcVar16 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)((long)&errorStr.field_2 + 8));
    TInfoSinkBase::message(&pTVar3->info,EPrefixInternalError,pcVar16);
    *this->hadError = true;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  ((long)&errorStr.field_2 + 8));
  }
  else {
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    uVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar7) + 0x148))();
    if ((((uVar15 & 1) == 0) && (this->profile == EEsProfile)) &&
       (((entKey->second).live & 1U) != 0)) {
      *this->hadError = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &ent2_1,&entKey->first,
                     ": not been declare as a output variable in pre shader stage.");
      pTVar3 = this->infoSink;
      pcVar16 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)&ent2_1);
      TInfoSinkBase::message(&pTVar3->info,EPrefixError,pcVar16);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &ent2_1);
    }
  }
  ent2._M_node._4_4_ = 1;
LAB_0064432f:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                &preStage);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                ((long)&mangleName2.field_2 + 8));
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent1 = entKey.second;
        TIntermSymbol* base = ent1.symbol;
        const TType& type = ent1.symbol->getType();
        const TString& name = entKey.first;
        TString mangleName1, mangleName2;
        EShLanguage stage = ent1.stage;
        EShLanguage preStage, currentStage, nextStage;

        preStage = EShLangCount;
        for (int i = stage - 1; i >= 0; i--) {
            if (inVarMaps[i] != nullptr) {
                preStage = static_cast<EShLanguage>(i);
                break;
            }
        }
        currentStage = stage;
        nextStage = EShLangCount;
        for (int i = stage + 1; i < EShLangCount; i++) {
            if (inVarMaps[i] != nullptr) {
                nextStage = static_cast<EShLanguage>(i);
                break;
            }
        }

        if (type.getQualifier().isArrayedIo(stage)) {
            TType subType(type, 0);
            subType.appendMangledName(mangleName1);
        } else {
            type.appendMangledName(mangleName1);
        }


        // basic checking that symbols match
        // more extensive checking in the link stage
        if (base->getQualifier().storage == EvqVaryingIn) {
            // validate stage in;
            if (preStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (outVarMaps[preStage] != nullptr) {
                auto ent2 = outVarMaps[preStage]->find(name);
                uint32_t location = base->getType().getQualifier().layoutLocation;
                if (ent2 == outVarMaps[preStage]->end() &&
                    location != glslang::TQualifier::layoutLocationEnd) {
                    for (auto var = outVarMaps[preStage]->begin(); var != ent2; var++) {
                        if (var->second.symbol->getType().getQualifier().layoutLocation == location) {
                            ent2 = var;
                            break;
                        }
                    }
                }
                if (ent2 != outVarMaps[preStage]->end()) {
                    auto& type1 = base->getType();
                    auto& type2 = ent2->second.symbol->getType();
                    hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(preStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }

                    if (mangleName1 == mangleName2) {
                        // For ES 3.0 only, other versions have no such restrictions
                        // According to ES 3.0 spec: The type and presence of the interpolation qualifiers and
                        // storage qualifiers  of variables with the same name declared in all linked shaders must
                        // match, otherwise the link command will fail.
                        if (profile == EEsProfile && version == 300) {
                            // Don't need to check smooth qualifier, as it uses the default interpolation mode
                            if (ent1.stage == EShLangFragment && type1.isBuiltIn() == false) {
                                if (type1.getQualifier().flat != type2.getQualifier().flat ||
                                    type1.getQualifier().nopersp != type2.getQualifier().nopersp) {
                                    TString err = "Interpolation qualifier mismatch : " + entKey.first;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                }
                            }
                        }
                        return;
                    }
                    else {
                        // Deal with input/output pairs where one is a block member but the other is loose,
                        // e.g. with ARB_separate_shader_objects
                        if (type1.getBasicType() == EbtBlock &&
                            type1.isStruct() && !type2.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type1.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName2
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        if (type2.getBasicType() == EbtBlock &&
                            type2.isStruct() && !type1.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type2.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName1
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                else if (!base->getType().isBuiltIn()) {
                    // According to spec: A link error is generated if any statically referenced input variable
                    // or block does not have a matching output
                    if (profile == EEsProfile && ent1.live) {
                        hadError = true;
                        TString errorStr = name + ": not been declare as a output variable in pre shader stage.";
                        infoSink.info.message(EPrefixError, errorStr.c_str());
                    }
                }
                return;
            }
        } else if (base->getQualifier().storage == EvqVaryingOut) {
            // validate stage out;
            if (nextStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (inVarMaps[nextStage] != nullptr) {
                auto ent2 = inVarMaps[nextStage]->find(name);
                if (ent2 != inVarMaps[nextStage]->end()) {
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(nextStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }
                    if (mangleName1 == mangleName2)
                        return;
                    else {
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                return;
            }
        } else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant()) {
            // validate uniform type;
            for (int i = 0; i < EShLangCount; i++) {
                if (i != currentStage && outVarMaps[i] != nullptr) {
                    auto ent2 = uniformVarMap[i]->find(name);
                    if (ent2 != uniformVarMap[i]->end()) {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                        if (mangleName1 != mangleName2) {
                            ent2->second.symbol->getType().sameElementType(type);
                            TString err = "Invalid Uniform variable type : " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }
                        mangleName2.clear();

                        // validate instance name of blocks
                        if (hadError == false &&
                            base->getType().getBasicType() == EbtBlock &&
                            IsAnonymous(base->getName()) != IsAnonymous(ent2->second.symbol->getName())) {
                            TString err = "Matched uniform block names must also either all be lacking "
                                          "an instance name or all having an instance name: " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }

                        // validate uniform block member qualifier and member names
                        auto& type1 = base->getType();
                        auto& type2 = ent2->second.symbol->getType();
                        if (hadError == false && base->getType().getBasicType() == EbtBlock) {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), true);
                        }
                        else {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                        }
                    }
                    else if (base->getBasicType() == EbtBlock)
                    {
                        if (IsAnonymous(base->getName()))
                        {
                            // The name of anonymous block member can't same with default uniform variable.
                            auto blockType1 = base->getType().getStruct();
                            for (size_t memberIdx = 0; memberIdx < blockType1->size(); ++memberIdx) {
                                auto memberName = (*blockType1)[memberIdx].type->getFieldName();
                                if (uniformVarMap[i]->find(memberName) != uniformVarMap[i]->end())
                                {
                                    TString err = "Invalid Uniform variable name : " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
    }